

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O0

void embree::renderPixelStandard
               (TutorialData *data,int x,int y,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,RayStats *stats,RTCFeatureFlags feature_mask)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  long in_RCX;
  int in_EDX;
  uint in_ESI;
  long *in_RDI;
  int in_R8D;
  float in_XMM0_Da;
  float fVar7;
  undefined8 *in_stack_00000008;
  int *in_stack_00000010;
  undefined4 in_stack_00000018;
  uint b;
  uint g;
  uint r;
  ISPCOBJMaterial *material;
  int materialID;
  DifferentialGeometry dg;
  Vec3fa color;
  RTCIntersectArguments args;
  Ray ray;
  float ray_time;
  RandomSampler sampler;
  uint hash;
  uint n_1;
  uint m_1;
  uint r2_1;
  uint r1_1;
  uint c2_1;
  uint c1_1;
  uint n;
  uint m;
  uint r2;
  uint r1;
  uint c2;
  uint c1;
  uint n_2;
  uint m_2;
  __m128 c_1;
  __m128 r_1;
  __m128 a_1;
  __m128 c_3;
  __m128 r_2;
  __m128 a_3;
  __m128 c_5;
  __m128 r_3;
  __m128 a_5;
  vint4 mask_1;
  vint4 mask;
  vfloat4 c_6;
  vfloat4 b_4;
  vfloat4 a_6;
  vfloat4 c_4;
  vfloat4 b_3;
  vfloat4 a_4;
  vfloat4 c_2;
  vfloat4 b_2;
  vfloat4 a_2;
  vfloat4 c;
  vfloat4 b_1;
  vfloat4 a;
  __m128 mask_2;
  float local_2088;
  float local_2084;
  float local_2080;
  float local_207c;
  float local_2078;
  float local_2074;
  float local_2030;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1fb8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1fa8;
  embree local_1f98 [8];
  float fStackY_1f90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1f88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1f78;
  embree local_1f68 [28];
  uint local_1f4c;
  undefined1 local_1f48 [8];
  ulong uStackY_1f40;
  undefined1 local_1f38 [8];
  Ray *pRStackY_1f30;
  undefined8 local_1f28;
  undefined8 uStackY_1f20;
  undefined8 local_1f18;
  undefined8 uStackY_1f10;
  undefined8 local_1f08;
  undefined8 uStackY_1f00;
  uint local_1ef4;
  uint local_1ef0;
  float local_1eec;
  float local_1ee8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ed8;
  undefined8 dg_00;
  undefined8 uVar8;
  undefined8 data_00;
  undefined8 local_1e78;
  undefined8 uStack_1e70;
  undefined4 local_1e68;
  undefined4 local_1e64;
  undefined8 local_1e60;
  undefined8 local_1e58;
  undefined8 local_1e50;
  undefined8 local_1e48;
  ulong uStack_1e40;
  undefined8 local_1e38;
  ulong uStack_1e30;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  undefined8 local_1e18;
  ulong uStack_1e10;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  ulong local_1dd8;
  ulong uStack_1dd0;
  undefined8 local_1dc8;
  ulong uStack_1dc0;
  undefined8 local_1db8;
  ulong uStack_1db0;
  ulong local_1da8;
  ulong uStack_1da0;
  float local_1d98;
  undefined4 local_1d94;
  undefined4 local_1d88;
  undefined4 local_1d84;
  float local_1d80;
  float local_1d7c;
  float local_1d78;
  uint local_1d74;
  uint local_1d70;
  undefined4 local_1d6c;
  undefined4 local_1d68;
  float local_1d54;
  uint local_1d50 [3];
  int local_1d44;
  long local_1d40;
  int local_1d38;
  uint local_1d34;
  long *local_1d30;
  undefined4 local_1d24;
  undefined8 *local_1d20;
  embree *local_1ce8;
  undefined1 *local_1ce0;
  undefined1 *local_1cd8;
  undefined1 *local_1cd0;
  undefined1 *local_1cc8;
  undefined1 *local_1cc0;
  undefined8 *local_1cb8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1cb0;
  undefined4 local_1ca4;
  uint *local_1c98;
  uint *local_1c90;
  undefined8 *local_1c88;
  undefined8 *local_1c80;
  undefined8 *local_1c70;
  undefined8 *local_1c68;
  undefined8 *local_1c60;
  undefined8 *local_1c58;
  undefined8 *local_1c50;
  undefined4 *local_1c48;
  undefined1 *local_1c40;
  undefined4 *local_1c38;
  undefined1 *local_1c30;
  undefined1 *local_1c28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1c20;
  undefined1 *local_1c18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1c10;
  undefined8 *local_1c08;
  ulong *local_1c00;
  undefined8 *local_1bf8;
  undefined8 *local_1bf0;
  undefined8 *local_1be8;
  undefined8 *local_1be0;
  undefined8 *local_1bd8;
  undefined8 *local_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined8 *local_1bb0;
  float local_1ba4;
  undefined8 *local_1ba0;
  float local_1b94;
  undefined8 *local_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 *local_1b78;
  float local_1b6c;
  undefined8 *local_1b68;
  float local_1b5c;
  undefined8 *local_1b58;
  undefined1 *local_1b50;
  undefined4 local_1b48;
  undefined4 local_1b44;
  undefined4 local_1b40;
  float local_1b3c;
  float local_1b38;
  undefined4 local_1b34;
  ulong *local_1b30;
  undefined8 *local_1b28;
  undefined8 *local_1b20;
  undefined4 *local_1b18;
  undefined8 *local_1b10;
  undefined8 *local_1b00;
  undefined8 *local_1af8;
  undefined8 *local_1af0;
  undefined1 local_1ae8 [24];
  ulong *local_1ad0;
  float local_1ac4;
  undefined8 *local_1ac0;
  ulong *local_1aa8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1aa0;
  ulong *local_1a98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1a90;
  undefined8 *local_1a88;
  undefined8 *local_1a80;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  float local_1a4c;
  undefined8 *local_1a48;
  ulong *local_1a40;
  float local_1a34;
  undefined8 *local_1a30;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  float local_1a0c;
  undefined1 *local_1a08;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1a00;
  float local_19f4;
  undefined8 *local_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  float local_19cc;
  undefined1 *local_19c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_19c0;
  float local_19b4;
  undefined8 *local_19b0;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 *local_1958;
  undefined8 *local_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined1 *local_1938;
  undefined1 *local_1930;
  undefined8 local_1928;
  ulong uStack_1920;
  undefined1 *local_1918;
  undefined1 *local_1910;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 *local_1840;
  ulong local_1838;
  ulong uStack_1830;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1820;
  ulong local_1818;
  ulong uStack_1810;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1800;
  float local_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  undefined8 *local_17c0;
  float local_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  undefined8 *local_17a0;
  float local_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float local_1768;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_16fc;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float local_16dc;
  undefined4 local_16d8;
  undefined4 uStack_16d4;
  undefined4 uStack_16d0;
  undefined4 uStack_16cc;
  undefined4 local_16c8;
  uint local_16c4;
  undefined4 local_16c0;
  uint local_16bc;
  uint *local_16b8;
  undefined4 local_16ac;
  undefined4 local_16a8;
  undefined4 local_16a4;
  undefined4 local_16a0;
  undefined4 local_169c;
  undefined4 local_1698;
  undefined4 local_1694;
  uint local_1690;
  undefined4 local_168c;
  undefined4 local_1688;
  undefined4 local_1684;
  undefined4 local_1680;
  undefined4 local_167c;
  undefined4 local_1678;
  uint local_1674;
  uint local_1670;
  uint local_166c;
  uint *local_1668;
  uint *local_1660;
  undefined4 local_1654;
  undefined4 local_1650;
  uint local_164c;
  ulong uStack_1640;
  undefined4 local_162c;
  Ray *pRStack_1620;
  undefined4 local_160c;
  undefined8 local_1608;
  ulong uStack_1600;
  undefined4 local_15f8;
  undefined4 local_15f4;
  float local_15f0;
  undefined4 local_15ec;
  undefined8 local_15e8;
  ulong uStack_15e0;
  undefined4 local_15d8;
  undefined4 local_15d4;
  uint local_15d0;
  undefined4 local_15cc;
  undefined8 local_15c8;
  ulong uStack_15c0;
  undefined4 local_15b8;
  undefined4 local_15b4;
  uint local_15b0;
  undefined4 local_15ac;
  undefined8 local_15a8;
  ulong uStack_15a0;
  undefined4 local_1598;
  undefined4 local_1594;
  uint local_1590;
  undefined4 local_158c;
  ulong local_1588;
  undefined8 uStack_1580;
  undefined1 local_1578 [16];
  ulong local_1568;
  undefined8 uStack_1560;
  float local_154c;
  ulong local_1548;
  undefined8 uStack_1540;
  undefined1 local_1538 [16];
  ulong local_1528;
  undefined8 uStack_1520;
  float local_150c;
  ulong local_1508;
  undefined8 uStack_1500;
  undefined1 local_14f8 [16];
  ulong local_14e8;
  undefined8 uStack_14e0;
  float local_14cc;
  undefined1 local_14c8 [16];
  undefined4 local_14ac;
  undefined1 local_14a8 [16];
  undefined4 local_148c;
  undefined1 local_1488 [16];
  float local_146c;
  undefined1 local_1468 [16];
  undefined4 local_144c;
  undefined1 local_1448 [16];
  undefined4 local_142c;
  undefined1 local_1428 [16];
  float local_140c;
  undefined1 local_1408 [16];
  undefined4 local_13ec;
  undefined1 local_13e8 [16];
  undefined4 local_13cc;
  undefined1 local_13c8 [16];
  float local_13ac;
  ulong local_13a8;
  undefined8 uStack_13a0;
  ulong local_1398;
  undefined8 uStack_1390;
  ulong local_1388;
  undefined8 uStack_1380;
  ulong local_1378;
  undefined8 uStack_1370;
  ulong local_1368;
  undefined8 uStack_1360;
  ulong local_1358;
  undefined8 uStack_1350;
  ulong local_1348;
  undefined8 uStack_1340;
  ulong local_1338;
  undefined8 uStack_1330;
  ulong local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  ulong local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  ulong local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  ulong local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  ulong local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  ulong local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  ulong local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  ulong local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  ulong local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  ulong local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  ulong local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  ulong local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  ulong local_1148;
  undefined8 uStack_1140;
  ulong local_1138;
  undefined8 uStack_1130;
  ulong local_1128;
  undefined8 uStack_1120;
  ulong local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  ulong uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined1 *local_1070;
  undefined1 *local_1068;
  undefined8 *local_1060;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  undefined4 uStack_104c;
  undefined8 *local_1048;
  undefined1 *local_1040;
  undefined1 *local_1038;
  undefined8 *local_1030;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined8 *local_1018;
  undefined8 *local_1010;
  undefined8 *local_1008;
  undefined8 *local_1000;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined8 *local_fe8;
  undefined8 *local_fb0;
  undefined1 *local_fa8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_fa0;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_f88;
  undefined8 *local_f80;
  undefined1 *local_f78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_f70;
  float local_f68;
  float fStack_f64;
  float fStack_f60;
  float fStack_f5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_f58;
  undefined8 *local_f50;
  undefined8 *local_f48;
  ulong *local_f40;
  float local_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  ulong *local_f28;
  undefined8 *local_f20;
  undefined8 *local_f18;
  undefined8 *local_f10;
  float local_f08;
  float fStack_f04;
  float fStack_f00;
  float fStack_efc;
  undefined8 *local_ef8;
  undefined8 *local_ef0;
  undefined8 *local_ee8;
  undefined8 *local_ee0;
  float local_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  undefined8 *local_ec0;
  float local_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  float local_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e38;
  undefined8 uStack_e30;
  ulong uStack_e20;
  float local_e08;
  float fStack_e04;
  float fStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  float local_dc8;
  float fStack_dc4;
  float fStack_dc0;
  float fStack_dbc;
  ulong uStack_db0;
  float local_da8;
  float fStack_da4;
  ulong uStack_da0;
  float local_d98;
  float fStack_d94;
  float local_d88;
  float fStack_d84;
  float fStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  ulong local_d68;
  ulong uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  ulong local_d48;
  ulong uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  float local_d1c;
  ulong *local_d18;
  ulong *local_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  ulong uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  ulong uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined4 local_cb4;
  undefined8 *local_cb0;
  undefined8 *local_ca8;
  undefined4 *local_ca0;
  undefined4 local_c98;
  undefined4 local_c94;
  undefined4 local_c90;
  undefined4 local_c8c;
  undefined8 *local_c88;
  undefined4 local_c80;
  undefined4 local_c7c;
  undefined4 local_c78;
  undefined4 local_c74;
  undefined8 *local_c70;
  undefined8 *local_c68;
  undefined8 *local_c60;
  undefined8 *local_c58;
  undefined8 *local_c50;
  undefined8 *local_c48;
  ulong *local_c40;
  undefined8 *local_c38;
  ulong *local_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 *local_c08;
  undefined8 *local_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 *local_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 *local_bc0;
  ulong local_bb8;
  ulong uStack_bb0;
  ulong *local_ba0;
  undefined8 local_b98;
  ulong uStack_b90;
  undefined8 *local_b80;
  undefined8 local_b78;
  ulong uStack_b70;
  undefined8 *local_b60;
  ulong local_b58;
  ulong uStack_b50;
  ulong *local_b40;
  undefined4 local_b34;
  undefined8 *local_b30;
  undefined4 local_b28;
  undefined4 uStack_b24;
  undefined4 uStack_b20;
  undefined4 uStack_b1c;
  undefined4 local_b18;
  float local_b14;
  undefined8 *local_b10;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float local_aec;
  undefined8 *local_ae8;
  ulong *local_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined4 local_ac8;
  undefined4 local_ac4;
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined4 local_aa8;
  undefined4 local_aa4;
  undefined4 local_aa0;
  undefined4 local_a9c;
  undefined4 local_a98;
  undefined4 uStack_a94;
  undefined4 uStack_a90;
  float fStack_a8c;
  ulong local_a88;
  ulong uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  ulong uStack_a60;
  ulong local_a58;
  ulong uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  ulong uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 *local_a18;
  undefined8 *local_a10;
  undefined8 *local_a08;
  undefined8 *local_a00;
  undefined8 *local_9f8;
  ulong *local_9f0;
  undefined8 *local_9e8;
  undefined8 *local_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  float local_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  undefined8 *local_988;
  ulong *local_980;
  undefined1 *local_978;
  undefined8 *local_970;
  undefined8 local_968;
  undefined8 uStack_960;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  undefined8 *local_930;
  float local_924;
  undefined1 *local_920;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_8fc;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  ulong uStack_820;
  undefined8 *local_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  ulong uStack_7f0;
  undefined8 *local_7e8;
  undefined8 *local_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 *local_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 *local_758;
  undefined8 *local_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 *local_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 *local_6c0;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  undefined8 *local_6a0;
  undefined8 *local_698;
  undefined8 *local_690;
  undefined8 *local_688;
  undefined8 *local_670;
  undefined8 *local_668;
  undefined8 *local_660;
  undefined8 *local_658;
  undefined8 *local_650;
  undefined8 *local_648;
  undefined8 *local_630;
  undefined8 *local_628;
  undefined8 *local_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined8 *local_588;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined8 *local_570;
  undefined8 *local_568;
  undefined8 *local_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined8 *local_528;
  undefined8 *local_520;
  undefined8 *local_518;
  undefined8 *local_510;
  undefined8 *local_508;
  undefined8 *local_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 *local_468;
  undefined8 *local_460;
  undefined8 *local_458;
  undefined8 *local_450;
  undefined8 *local_448;
  undefined8 *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  ulong uStack_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined8 *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  ulong uStack_200;
  undefined8 *local_198;
  undefined8 *local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 *local_168;
  undefined8 *local_160;
  undefined8 local_158;
  ulong uStack_150;
  undefined8 *local_148;
  undefined8 *local_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  
  local_1c98 = local_1d50;
  local_1ca4 = 0;
  local_16bc = in_ESI | in_EDX << 0x10;
  local_16c0 = 0;
  local_1678 = 0xcc9e2d51;
  local_167c = 0x1b873593;
  local_1680 = 0xf;
  local_1684 = 0xd;
  local_1688 = 5;
  local_168c = 0xe6546b64;
  uVar6 = local_16bc * 0x16a88000 | local_16bc * -0x3361d2af >> 0x11;
  local_1674 = uVar6 * 0x1b873593;
  local_1670 = (uVar6 * -0x194da000 | local_1674 >> 0x13) * 5 + 0xe6546b64;
  local_1698 = 0xcc9e2d51;
  local_169c = 0x1b873593;
  local_16a0 = 0xf;
  local_16a4 = 0xd;
  local_16a8 = 5;
  local_16ac = 0xe6546b64;
  local_1694 = 0;
  local_1690 = (local_1670 * 0x2000 | local_1670 >> 0x13) * 5 + 0xe6546b64;
  uVar6 = (local_1690 >> 0x10 ^ local_1690) * -0x7a143595;
  local_16c4 = (uVar6 >> 0xd ^ uVar6) * -0x3d4d51cb;
  local_16c4 = local_16c4 >> 0x10 ^ local_16c4;
  local_2030 = in_XMM0_Da;
  uVar6 = local_16c4;
  if ((*(byte *)((long)in_RDI + 0x21) & 1) != 0) {
    local_1c90 = local_1d50;
    local_1650 = 0x19660d;
    local_1654 = 0x3c6ef35f;
    local_2030 = (float)(local_1d50[0] >> 1) * 4.656613e-10;
    local_1668 = local_1c90;
    local_1660 = local_1c90;
    local_164c = local_16c4;
    uVar6 = local_16c4 * 0x19660d + 0x3c6ef35f;
  }
  local_1d50[0] = uVar6;
  local_1d54 = local_2030;
  local_1c88 = (undefined8 *)((long)in_stack_00000008 + 0x24);
  local_1590 = *(uint *)((long)in_stack_00000008 + 0x2c);
  local_1598 = *(undefined4 *)local_1c88;
  local_1594 = *(undefined4 *)(in_stack_00000008 + 5);
  local_15a8 = *local_1c88;
  local_158c = 0;
  uStack_15a0 = (ulong)local_1590;
  local_1b6c = (float)(int)in_ESI;
  local_1c70 = &local_1e18;
  local_15b0 = *(uint *)(in_stack_00000008 + 1);
  local_15b8 = *(undefined4 *)in_stack_00000008;
  local_15b4 = *(undefined4 *)((long)in_stack_00000008 + 4);
  local_15c8 = *in_stack_00000008;
  local_15ac = 0;
  uStack_15c0 = (ulong)local_15b0;
  local_1bd8 = &local_1e08;
  local_1b58 = &local_1b88;
  local_e88 = CONCAT44(local_1b6c,local_1b6c);
  uStack_e80 = CONCAT44(local_1b6c,local_1b6c);
  local_e98 = (float)local_1e18;
  fStack_e94 = (float)((ulong)local_1e18 >> 0x20);
  fStack_e90 = (float)uStack_1e10;
  fStack_e8c = (float)(uStack_1e10 >> 0x20);
  local_f08 = local_1b6c * local_e98;
  fStack_f04 = local_1b6c * fStack_e94;
  fStack_f00 = local_1b6c * fStack_e90;
  fStack_efc = local_1b6c * fStack_e8c;
  local_10d8 = CONCAT44(fStack_f04,local_f08);
  uStack_10d0 = CONCAT44(fStack_efc,fStack_f00);
  local_1ba4 = (float)in_EDX;
  local_1c68 = (undefined8 *)((long)in_stack_00000008 + 0xc);
  local_1c60 = &local_1e38;
  local_15d0 = *(uint *)((long)in_stack_00000008 + 0x14);
  local_15d8 = *(undefined4 *)local_1c68;
  local_15d4 = *(undefined4 *)(in_stack_00000008 + 2);
  local_15e8 = *local_1c68;
  local_15cc = 0;
  uStack_15e0 = (ulong)local_15d0;
  local_1be0 = &local_1e28;
  local_1b90 = &local_1bc8;
  local_ea8 = CONCAT44(local_1ba4,local_1ba4);
  uStack_ea0 = CONCAT44(local_1ba4,local_1ba4);
  local_eb8 = (float)local_1e38;
  fStack_eb4 = (float)((ulong)local_1e38 >> 0x20);
  fStack_eb0 = (float)uStack_1e30;
  fStack_eac = (float)(uStack_1e30 >> 0x20);
  local_ed8 = local_1ba4 * local_eb8;
  fStack_ed4 = local_1ba4 * fStack_eb4;
  fStack_ed0 = local_1ba4 * fStack_eb0;
  fStack_ecc = local_1ba4 * fStack_eac;
  local_10e8 = CONCAT44(fStack_ed4,local_ed8);
  uStack_10e0 = CONCAT44(fStack_ecc,fStack_ed0);
  local_1bf0 = &local_1df8;
  local_17d8 = local_f08 + local_ed8;
  fStack_17d4 = fStack_f04 + fStack_ed4;
  fStack_17d0 = fStack_f00 + fStack_ed0;
  fStack_17cc = fStack_efc + fStack_ecc;
  local_10b8 = CONCAT44(fStack_17d4,local_17d8);
  uStack_10b0 = CONCAT44(fStack_17cc,fStack_17d0);
  local_1c58 = in_stack_00000008 + 3;
  local_1c50 = &local_1e48;
  local_15f0 = *(float *)(in_stack_00000008 + 4);
  local_15f8 = *(undefined4 *)local_1c58;
  local_15f4 = *(undefined4 *)((long)in_stack_00000008 + 0x1c);
  local_1608 = *local_1c58;
  local_15ec = 0;
  uStack_1600 = (ulong)(uint)local_15f0;
  local_1c08 = &local_1de8;
  local_10c8._0_4_ = (float)local_1608;
  local_10c8._4_4_ = (float)((ulong)local_1608 >> 0x20);
  local_17b8 = local_17d8 + (float)local_10c8;
  fStack_17b4 = fStack_17d4 + local_10c8._4_4_;
  fStack_17b0 = fStack_17d0 + local_15f0;
  fStack_17ac = fStack_17cc + 0.0;
  local_e68 = CONCAT44(fStack_17b4,local_17b8);
  uStack_e60 = CONCAT44(fStack_17ac,fStack_17b0);
  local_1000 = &local_1968;
  local_ff8 = local_17b8 * local_17b8;
  fStack_ff4 = fStack_17b4 * fStack_17b4;
  fStack_ff0 = fStack_17b0 * fStack_17b0;
  fStack_fec = fStack_17ac * fStack_17ac;
  local_6d8 = CONCAT44(fStack_ff4,local_ff8);
  uStack_6d0 = CONCAT44(fStack_fec,fStack_ff0);
  local_6c0 = &local_708;
  local_6a8 = &local_718;
  local_5b8 = CONCAT44(fStack_ff4,fStack_ff4);
  uStack_5b0 = CONCAT44(fStack_ff4,fStack_ff4);
  local_668 = &local_728;
  local_618 = CONCAT44(fStack_ff0,fStack_ff0);
  uStack_610 = CONCAT44(fStack_ff0,fStack_ff0);
  local_628 = &local_748;
  local_598 = local_ff8 + fStack_ff4;
  fStack_594 = fStack_ff4 + fStack_ff4;
  fStack_590 = fStack_ff0 + fStack_ff4;
  fStack_58c = fStack_fec + fStack_ff4;
  local_608 = CONCAT44(fStack_594,local_598);
  uStack_600 = CONCAT44(fStack_58c,fStack_590);
  local_6b8 = &local_738;
  local_154c = local_598 + fStack_ff0;
  fStack_5f4 = fStack_594 + fStack_ff0;
  fStack_5f0 = fStack_590 + fStack_ff0;
  fStack_5ec = fStack_58c + fStack_ff0;
  local_6e8 = CONCAT44(fStack_5f4,local_154c);
  uStack_6e0 = CONCAT44(fStack_5ec,fStack_5f0);
  local_13c8 = ZEXT416((uint)local_154c);
  local_1568 = CONCAT44(0,local_154c);
  uStack_1560 = 0;
  uStack_1380 = 0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_1568;
  local_1578 = rsqrtss(auVar5,auVar5);
  local_13cc = 0x3fc00000;
  local_13e8 = ZEXT416(0x3fc00000);
  local_1158 = local_1578._0_8_;
  uVar8 = local_1158;
  uStack_1150 = local_1578._8_8_;
  local_1158._0_4_ = local_1578._0_4_;
  local_1148 = (ulong)(uint)((float)local_1158 * 1.5);
  uStack_1140 = 0;
  local_13ec = 0xbf000000;
  local_1408 = ZEXT416(0xbf000000);
  local_1178 = local_1408._0_8_;
  uStack_1170 = 0;
  local_1168 = (ulong)(uint)(local_154c * -0.5);
  uStack_1160 = 0;
  local_1198 = local_1578._0_8_;
  uStack_1190 = local_1578._8_8_;
  local_1a4c = local_154c * -0.5 * (float)local_1158;
  local_1188 = (ulong)(uint)local_1a4c;
  uStack_1180 = 0;
  local_11b8 = local_1578._0_8_;
  uStack_11b0 = local_1578._8_8_;
  local_11a8 = CONCAT44(local_1578._4_4_,(float)local_1158 * (float)local_1158);
  uStack_11a0 = local_1578._8_8_;
  local_11d8 = local_11a8;
  uStack_11d0 = local_1578._8_8_;
  local_1a4c = local_1a4c * (float)local_1158 * (float)local_1158;
  local_11c8 = (ulong)(uint)local_1a4c;
  uStack_11c0 = 0;
  local_1338 = local_11c8;
  uStack_1330 = 0;
  local_1a4c = (float)local_1158 * 1.5 + local_1a4c;
  local_1328 = (ulong)(uint)local_1a4c;
  uStack_1320 = 0;
  local_1588 = local_1328;
  uStack_1580 = 0;
  local_1118 = local_1328;
  uStack_1110 = 0;
  local_1a30 = &local_1a68;
  local_e78 = CONCAT44(local_1a4c,local_1a4c);
  uStack_e70 = CONCAT44(local_1a4c,local_1a4c);
  local_f38 = local_17b8 * local_1a4c;
  fStack_f34 = fStack_17b4 * local_1a4c;
  fStack_f30 = fStack_17b0 * local_1a4c;
  fStack_f2c = fStack_17ac * local_1a4c;
  local_1dd8 = CONCAT44(fStack_f34,local_f38);
  uStack_1dd0 = CONCAT44(fStack_f2c,fStack_f30);
  local_1b50 = &inf;
  local_1d44 = in_R8D;
  local_1d40 = in_RCX;
  local_1d38 = in_EDX;
  local_1d34 = in_ESI;
  local_1d30 = in_RDI;
  local_1c80 = &local_1dc8;
  local_1c00 = &local_1dd8;
  local_1bf8 = local_1c50;
  local_1be8 = local_1c08;
  local_1bd0 = local_1bf0;
  local_1bb0 = local_1c60;
  local_1ba0 = local_1be0;
  local_1b94 = local_1ba4;
  local_1b78 = local_1c70;
  local_1b68 = local_1bd8;
  local_1b5c = local_1b6c;
  local_1a48 = local_1c08;
  local_1a40 = &local_1dd8;
  local_1a34 = local_1a4c;
  local_1958 = local_1c08;
  local_1950 = local_1c08;
  local_17c0 = local_1bf0;
  local_17a0 = local_1c08;
  local_1738 = local_1a4c;
  fStack_1734 = local_1a4c;
  fStack_1730 = local_1a4c;
  fStack_172c = local_1a4c;
  local_171c = local_1a4c;
  local_1718 = local_1b6c;
  fStack_1714 = local_1b6c;
  fStack_1710 = local_1b6c;
  fStack_170c = local_1b6c;
  local_16fc = local_1b6c;
  local_16f8 = local_1ba4;
  fStack_16f4 = local_1ba4;
  fStack_16f0 = local_1ba4;
  fStack_16ec = local_1ba4;
  local_16dc = local_1ba4;
  local_16b8 = local_1c98;
  local_166c = local_16c4;
  local_13ac = local_154c;
  local_1388 = local_1568;
  local_1158 = uVar8;
  local_10c8 = local_1608;
  uStack_10c0 = uStack_1600;
  local_1010 = local_1c08;
  local_1008 = local_1c08;
  local_fe8 = local_1000;
  local_f50 = local_1a30;
  local_f48 = local_1c08;
  local_f40 = &local_1dd8;
  local_f28 = &local_1dd8;
  local_f20 = local_1c70;
  local_f18 = local_1b58;
  local_f10 = local_1bd8;
  local_ef8 = local_1bd8;
  local_ef0 = local_1c60;
  local_ee8 = local_1b90;
  local_ee0 = local_1be0;
  local_ec0 = local_1be0;
  local_df8 = local_e68;
  uStack_df0 = uStack_e60;
  local_de8 = local_e68;
  uStack_de0 = uStack_e60;
  local_6f0 = local_1000;
  local_6b0 = local_6c0;
  local_670 = local_6c0;
  local_630 = local_668;
  local_620 = local_6b8;
  local_5f8 = local_154c;
  local_5e8 = local_6b8;
  local_5e0 = local_668;
  local_5d8 = local_628;
  local_5d0 = local_6a8;
  local_5c8 = local_6c0;
  local_5c0 = local_628;
  local_5a8 = local_6d8;
  uStack_5a0 = uStack_6d0;
  local_588 = local_628;
  local_580 = local_6a8;
  local_578 = local_6c0;
  local_268 = local_6c0;
  local_260 = local_6a8;
  local_258 = fStack_ff4;
  fStack_254 = fStack_ff4;
  fStack_250 = fStack_ff4;
  fStack_24c = fStack_ff4;
  local_248 = local_5b8;
  uStack_240 = uStack_5b0;
  local_238 = local_6a8;
  local_230 = local_6c0;
  local_228 = local_6d8;
  uStack_220 = uStack_6d0;
  local_f8 = local_6c0;
  local_f0 = local_668;
  local_e8 = fStack_ff0;
  fStack_e4 = fStack_ff0;
  fStack_e0 = fStack_ff0;
  fStack_dc = fStack_ff0;
  local_d8 = local_618;
  uStack_d0 = uStack_610;
  local_c8 = local_668;
  local_c0 = local_6c0;
  local_b8 = local_6d8;
  uStack_b0 = uStack_6d0;
  local_1e48 = local_1608;
  uStack_1e40 = uStack_1600;
  local_1e38 = local_15e8;
  uStack_1e30 = uStack_15e0;
  local_1e28 = local_10e8;
  uStack_1e20 = uStack_10e0;
  local_1e18 = local_15c8;
  uStack_1e10 = uStack_15c0;
  local_1e08 = local_10d8;
  uStack_1e00 = uStack_10d0;
  local_1df8 = local_10b8;
  uStack_1df0 = uStack_10b0;
  local_1de8 = local_e68;
  uStack_1de0 = uStack_e60;
  local_1dc8 = local_15a8;
  uStack_1dc0 = uStack_15a0;
  local_1bc8 = local_ea8;
  uStack_1bc0 = uStack_ea0;
  local_1b88 = local_e88;
  uStack_1b80 = uStack_e80;
  local_1a68 = local_e78;
  uStack_1a60 = uStack_e70;
  local_1968 = local_6d8;
  uStack_1960 = uStack_6d0;
  local_748 = local_608;
  uStack_740 = uStack_600;
  local_738 = local_6e8;
  uStack_730 = uStack_6e0;
  local_728 = local_618;
  uStack_720 = uStack_610;
  local_718 = local_5b8;
  uStack_710 = uStack_5b0;
  local_708 = local_6d8;
  uStack_700 = uStack_6d0;
  local_1d98 = std::numeric_limits<float>::infinity();
  local_1b20 = &local_1db8;
  local_1b34 = 0;
  local_1b3c = local_1d54;
  local_1b40 = 0xffffffff;
  local_1b44 = 0xffffffff;
  local_1b48 = 0xffffffff;
  local_cb4 = 0;
  local_c88 = &local_cc8;
  local_c8c = 0xffffffff;
  local_c90 = 0xffffffff;
  local_c94 = 0xffffffff;
  local_c98 = 0;
  local_a9c = 0;
  local_aa0 = 0xffffffff;
  local_aa4 = 0xffffffff;
  local_aa8 = 0xffffffff;
  local_ab8 = 0xffffffffffffffff;
  uStack_ab0 = 0xffffffff;
  local_cc8 = 0xffffffffffffffff;
  uStack_cc0 = 0xffffffff;
  local_c28 = 0xffffffffffffffff;
  uStack_c20 = 0xffffffff;
  local_c58 = &local_ce8;
  local_ce8 = 0xffffffffffffffff;
  uStack_ce0 = 0xffffffff;
  local_b98 = local_1dc8;
  uStack_b70 = uStack_1dc0;
  local_c60 = &local_cf8;
  local_c68 = &local_d08;
  local_b34 = 0;
  local_b18 = 0;
  local_b28 = 0;
  uStack_b24 = 0;
  uStack_b20 = 0;
  uStack_b1c = 0;
  local_9b8 = 0;
  uStack_9b0 = 0;
  local_c50 = &local_cd8;
  local_a28 = 0xffffffffffffffff;
  uStack_a20 = 0xffffffff;
  uStack_b90 = uStack_1dc0 & 0xffffffff;
  local_9a8 = 0xffffffffffffffff;
  uStack_9a0 = 0xffffffff;
  local_a78 = 0;
  uStack_a70 = 0;
  local_d10 = &local_1da8;
  local_d1c = local_1d54;
  local_c70 = &local_d38;
  local_c74 = 0xffffffff;
  local_c78 = 0xffffffff;
  local_c7c = 0xffffffff;
  local_c80 = 0;
  local_abc = 0;
  local_ac0 = 0xffffffff;
  local_ac4 = 0xffffffff;
  local_ac8 = 0xffffffff;
  local_ad8 = 0xffffffffffffffff;
  uStack_ad0 = 0xffffffff;
  local_d38 = 0xffffffffffffffff;
  uStack_d30 = 0xffffffff;
  local_c18 = 0xffffffffffffffff;
  uStack_c10 = 0xffffffff;
  local_c38 = &local_d58;
  local_d58 = 0xffffffffffffffff;
  uStack_d50 = 0xffffffff;
  local_bb8 = local_1dd8;
  uStack_b50 = uStack_1dd0;
  local_c40 = &local_d68;
  local_c48 = &local_d78;
  local_b14 = local_1d54;
  local_aec = local_1d54;
  local_b08 = local_1d54;
  fStack_b04 = local_1d54;
  fStack_b00 = local_1d54;
  fStack_afc = local_1d54;
  local_9d8 = CONCAT44(local_1d54,local_1d54);
  uStack_9d0 = CONCAT44(local_1d54,local_1d54);
  local_c30 = &local_d48;
  local_a48 = 0xffffffffffffffff;
  uStack_a40 = 0xffffffff;
  uStack_a80 = uStack_1dd0 & 0xffffffff;
  local_9c8 = 0xffffffffffffffff;
  uStack_9c0 = 0xffffffff;
  local_a98 = 0;
  uStack_a94 = 0;
  uStack_a90 = 0;
  fStack_a8c = local_1d54;
  uStack_bb0 = uStack_a80 | (ulong)(uint)local_1d54 << 0x20;
  local_ba0 = &local_d48;
  local_ae0 = &local_d48;
  local_1d94 = 0xffffffff;
  local_ca0 = &local_1d88;
  local_1d74 = 0xffffffff;
  local_1d70 = 0xffffffff;
  local_1d6c = 0xffffffff;
  local_1d68 = 0xffffffff;
  local_1b18 = &local_1e68;
  local_1e60 = 0;
  local_1e58 = 0;
  local_1e50 = 0;
  local_1e68 = *(undefined4 *)((long)local_1d30 + 0xc);
  local_1e64 = in_stack_00000018;
  local_1b10 = &local_1db8;
  local_1b38 = local_1d98;
  local_1b30 = &local_1dd8;
  local_1b28 = &local_1dc8;
  local_d18 = &local_1dd8;
  local_cb0 = &local_1dc8;
  local_ca8 = local_1b20;
  local_c08 = local_c88;
  local_c00 = local_c70;
  local_bf8 = local_c28;
  uStack_bf0 = uStack_c20;
  local_be0 = local_c58;
  local_bd8 = local_c18;
  uStack_bd0 = uStack_c10;
  local_bc0 = local_c38;
  local_b80 = local_c50;
  local_b78 = local_b98;
  local_b60 = local_c60;
  local_b58 = local_bb8;
  local_b40 = local_c40;
  local_b30 = local_c68;
  local_b10 = local_c48;
  local_ae8 = local_c50;
  local_a88 = local_bb8;
  local_a68 = local_b98;
  uStack_a60 = uStack_b90;
  local_a58 = local_bb8;
  uStack_a50 = uStack_b50;
  local_a38 = local_b98;
  uStack_a30 = uStack_b70;
  local_a18 = local_c38;
  local_a10 = local_c38;
  local_a08 = local_c58;
  local_a00 = local_c58;
  local_9f8 = local_c48;
  local_9f0 = local_c40;
  local_9e8 = local_c68;
  local_9e0 = local_c60;
  local_1db8 = local_b98;
  uStack_1db0 = uStack_b90;
  local_1da8 = local_bb8;
  uStack_1da0 = uStack_bb0;
  local_d78 = local_9d8;
  uStack_d70 = uStack_9d0;
  local_d68 = local_bb8;
  uStack_d60 = uStack_b50;
  local_d48 = local_bb8;
  uStack_d40 = uStack_bb0;
  local_d08 = local_9b8;
  uStack_d00 = uStack_9b0;
  local_cf8 = local_b98;
  uStack_cf0 = uStack_b70;
  local_cd8 = local_b98;
  uStack_cd0 = uStack_b90;
  rtcTraversableIntersect1(local_1d30[3],local_1b10,&local_1e68);
  *in_stack_00000010 = *in_stack_00000010 + 1;
  if (local_1d70 == 0xffffffff) {
    *(undefined4 *)(local_1d40 + (ulong)(local_1d38 * local_1d44 + local_1d34) * 4) = 0;
  }
  else {
    local_1d20 = &local_1e78;
    local_1d24 = 0x3f000000;
    local_16c8 = 0x3f000000;
    local_16d8 = 0x3f000000;
    uStack_16d4 = 0x3f000000;
    uStack_16d0 = 0x3f000000;
    uStack_16cc = 0x3f000000;
    local_1e78 = 0x3f0000003f000000;
    uStack_1e70 = 0x3f0000003f000000;
    DifferentialGeometry::DifferentialGeometry((DifferentialGeometry *)&stack0xffffffffffffe108);
    local_1ef4 = local_1d70;
    local_1ef0 = local_1d74;
    local_1eec = local_1d7c;
    local_1ee8 = local_1d78;
    local_1b00 = &local_1f28;
    local_1ac4 = local_1d98;
    local_978 = local_1ae8;
    local_924 = local_1d98;
    local_8fc = local_1d98;
    local_918 = local_1d98;
    fStack_914 = local_1d98;
    fStack_910 = local_1d98;
    fStack_90c = local_1d98;
    local_968._0_4_ = (float)local_1da8;
    local_968._4_4_ = (float)(local_1da8 >> 0x20);
    uStack_960._0_4_ = (float)uStack_1da0;
    uStack_960._4_4_ = (float)(uStack_1da0 >> 0x20);
    local_948 = local_1d98 * (float)local_968;
    fStack_944 = local_1d98 * local_968._4_4_;
    fStack_940 = local_1d98 * (float)uStack_960;
    fStack_93c = local_1d98 * uStack_960._4_4_;
    local_1108 = CONCAT44(fStack_944,local_948);
    uStack_1100 = CONCAT44(fStack_93c,fStack_940);
    local_1af0 = &local_1f18;
    local_1af8 = &local_1db8;
    local_10f8._0_4_ = (float)local_1db8;
    local_10f8._4_4_ = (float)((ulong)local_1db8 >> 0x20);
    uStack_10f0._0_4_ = (float)uStack_1db0;
    uStack_10f0._4_4_ = (float)(uStack_1db0 >> 0x20);
    local_998 = (float)local_10f8 + local_948;
    fStack_994 = local_10f8._4_4_ + fStack_944;
    fStack_990 = (float)uStack_10f0 + fStack_940;
    fStack_98c = uStack_10f0._4_4_ + fStack_93c;
    local_1858 = CONCAT44(fStack_994,local_998);
    uStack_1850 = CONCAT44(fStack_98c,fStack_990);
    local_1cb8 = &local_1f08;
    local_1cb0 = &local_1ed8;
    local_1c48 = &local_1d88;
    local_1cc8 = local_1f38;
    dg_00 = CONCAT44(local_1d84,local_1d88);
    local_160c = 0;
    uVar8 = ZEXT48((uint)local_1d80);
    local_1cd8 = local_1f48;
    data_00 = CONCAT44(local_1d84,local_1d88);
    local_162c = 0;
    uVar2 = (ulong)(uint)local_1d80;
    local_1cd0 = &stack0xffffffffffffe148;
    local_1cc0 = &stack0xffffffffffffe138;
    local_1c40 = local_1cc8;
    local_1c38 = local_1c48;
    local_1c30 = local_1cd8;
    local_1ad0 = &local_1da8;
    local_1ac0 = local_1b00;
    local_1a88 = local_1af0;
    local_1a80 = local_1cb8;
    local_1840 = local_1cb8;
    uStack_1640 = uVar2;
    pRStack_1620 = (Ray *)uVar8;
    local_10f8 = local_1db8;
    uStack_10f0 = uStack_1db0;
    local_988 = local_1af0;
    local_980 = &local_1da8;
    local_970 = local_1b00;
    local_968 = local_1da8;
    uStack_960 = uStack_1da0;
    local_930 = local_1b00;
    local_920 = local_978;
    uStackY_1f40 = uVar2;
    pRStackY_1f30 = (Ray *)uVar8;
    local_1f28 = local_1108;
    uStackY_1f20 = uStack_1100;
    local_1f18 = local_1858;
    uStackY_1f10 = uStack_1850;
    local_1f08 = local_1858;
    uStackY_1f00 = uStack_1850;
    local_1ed8._0_8_ = local_1858;
    local_1ed8._8_8_ = uStack_1850;
    local_1f4c = postIntersect((TutorialData *)data_00,(Ray *)uVar8,(DifferentialGeometry *)dg_00);
    local_1a90 = &local_1f78;
    local_1838 = local_1da8;
    uStack_1830 = uStack_1da0;
    local_1f78._0_8_ = local_1da8;
    local_1f78._8_8_ = uStack_1da0;
    local_1c10 = &local_1f88;
    local_1030 = &local_1948;
    local_dc8 = (float)dg_00;
    fStack_dc4 = (float)((ulong)dg_00 >> 0x20);
    fStack_dc0 = (float)uVar8;
    fStack_dbc = (float)((ulong)uVar8 >> 0x20);
    local_1028 = local_dc8 * local_dc8;
    fStack_1024 = fStack_dc4 * fStack_dc4;
    fStack_1020 = fStack_dc0 * fStack_dc0;
    fStack_101c = fStack_dbc * fStack_dbc;
    local_768 = CONCAT44(fStack_1024,local_1028);
    uStack_760 = CONCAT44(fStack_101c,fStack_1020);
    local_758 = &local_798;
    local_698 = &local_7a8;
    local_4f8 = CONCAT44(fStack_1024,fStack_1024);
    uStack_4f0 = CONCAT44(fStack_1024,fStack_1024);
    local_658 = &local_7b8;
    local_558 = CONCAT44(fStack_1020,fStack_1020);
    uStack_550 = CONCAT44(fStack_1020,fStack_1020);
    local_568 = &local_7d8;
    local_4d8 = local_1028 + fStack_1024;
    fStack_4d4 = fStack_1024 + fStack_1024;
    fStack_4d0 = fStack_1020 + fStack_1024;
    fStack_4cc = fStack_101c + fStack_1024;
    local_548 = CONCAT44(fStack_4d4,local_4d8);
    uStack_540 = CONCAT44(fStack_4cc,fStack_4d0);
    local_750 = &local_7c8;
    local_150c = local_4d8 + fStack_1020;
    fStack_534 = fStack_4d4 + fStack_1020;
    fStack_530 = fStack_4d0 + fStack_1020;
    fStack_52c = fStack_4cc + fStack_1020;
    local_778 = CONCAT44(fStack_534,local_150c);
    uStack_770 = CONCAT44(fStack_52c,fStack_530);
    local_1428 = ZEXT416((uint)local_150c);
    local_1528 = CONCAT44(0,local_150c);
    uStack_1520 = 0;
    uStack_1390 = 0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_1528;
    local_1538 = rsqrtss(auVar4,auVar4);
    local_142c = 0x3fc00000;
    local_1448 = ZEXT416(0x3fc00000);
    local_11f8 = local_1538._0_8_;
    uVar8 = local_11f8;
    uStack_11f0 = local_1538._8_8_;
    local_11f8._0_4_ = local_1538._0_4_;
    local_11e8 = (ulong)(uint)((float)local_11f8 * 1.5);
    uStack_11e0 = 0;
    local_144c = 0xbf000000;
    local_1468 = ZEXT416(0xbf000000);
    local_1218 = local_1468._0_8_;
    uStack_1210 = 0;
    local_1208 = (ulong)(uint)(local_150c * -0.5);
    uStack_1200 = 0;
    local_1238 = local_1538._0_8_;
    uStack_1230 = local_1538._8_8_;
    local_1a0c = local_150c * -0.5 * (float)local_11f8;
    local_1228 = (ulong)(uint)local_1a0c;
    uStack_1220 = 0;
    local_1258 = local_1538._0_8_;
    uStack_1250 = local_1538._8_8_;
    local_1248 = CONCAT44(local_1538._4_4_,(float)local_11f8 * (float)local_11f8);
    uStack_1240 = local_1538._8_8_;
    local_1278 = local_1248;
    uStack_1270 = local_1538._8_8_;
    local_1a0c = local_1a0c * (float)local_11f8 * (float)local_11f8;
    local_1268 = (ulong)(uint)local_1a0c;
    uStack_1260 = 0;
    local_1358 = local_1268;
    uStack_1350 = 0;
    local_1a0c = (float)local_11f8 * 1.5 + local_1a0c;
    local_1348 = (ulong)(uint)local_1a0c;
    uStack_1340 = 0;
    local_1548 = local_1348;
    uStack_1540 = 0;
    local_1128 = local_1348;
    uStack_1120 = 0;
    local_19f0 = &local_1a28;
    local_e58 = CONCAT44(local_1a0c,local_1a0c);
    uStack_e50 = CONCAT44(local_1a0c,local_1a0c);
    local_f68 = local_dc8 * local_1a0c;
    fStack_f64 = fStack_dc4 * local_1a0c;
    fStack_f60 = fStack_dc0 * local_1a0c;
    fStack_f5c = fStack_dbc * local_1a0c;
    local_1f88._0_8_ = CONCAT44(fStack_f64,local_f68);
    local_1f88._8_8_ = CONCAT44(fStack_f5c,fStack_f60);
    local_1c18 = &stack0xffffffffffffe138;
    local_1a98 = &local_1da8;
    local_1a08 = &stack0xffffffffffffe138;
    local_1a00 = local_1c10;
    local_19f4 = local_1a0c;
    local_1938 = &stack0xffffffffffffe138;
    local_1930 = &stack0xffffffffffffe138;
    local_1820 = local_1a90;
    local_1758 = local_1a0c;
    fStack_1754 = local_1a0c;
    fStack_1750 = local_1a0c;
    fStack_174c = local_1a0c;
    local_173c = local_1a0c;
    local_140c = local_150c;
    local_1398 = local_1528;
    local_11f8 = uVar8;
    local_1040 = &stack0xffffffffffffe138;
    local_1038 = &stack0xffffffffffffe138;
    local_1018 = local_1030;
    local_f80 = local_19f0;
    local_f78 = &stack0xffffffffffffe138;
    local_f70 = local_1c10;
    local_f58 = local_1c10;
    local_780 = local_1030;
    local_6a0 = local_758;
    local_660 = local_758;
    local_570 = local_658;
    local_560 = local_750;
    local_538 = local_150c;
    local_528 = local_750;
    local_520 = local_658;
    local_518 = local_568;
    local_510 = local_698;
    local_508 = local_758;
    local_500 = local_568;
    local_4e8 = local_768;
    uStack_4e0 = uStack_760;
    local_4c8 = local_568;
    local_4c0 = local_698;
    local_4b8 = local_758;
    local_2a8 = local_758;
    local_2a0 = local_698;
    local_298 = fStack_1024;
    fStack_294 = fStack_1024;
    fStack_290 = fStack_1024;
    fStack_28c = fStack_1024;
    local_288 = local_4f8;
    uStack_280 = uStack_4f0;
    local_278 = local_698;
    local_270 = local_758;
    local_218 = local_768;
    uStack_210 = uStack_760;
    local_148 = local_758;
    local_140 = local_658;
    local_138 = fStack_1020;
    fStack_134 = fStack_1020;
    fStack_130 = fStack_1020;
    fStack_12c = fStack_1020;
    local_128 = local_558;
    uStack_120 = uStack_550;
    local_118 = local_658;
    local_110 = local_758;
    local_108 = local_768;
    uStack_100 = uStack_760;
    local_1a28 = local_e58;
    uStack_1a20 = uStack_e50;
    local_1948 = local_768;
    uStack_1940 = uStack_760;
    local_7d8 = local_548;
    uStack_7d0 = uStack_540;
    local_7c8 = local_778;
    uStack_7c0 = uStack_770;
    local_7b8 = local_558;
    uStack_7b0 = uStack_550;
    local_7a8 = local_4f8;
    uStack_7a0 = uStack_4f0;
    local_798 = local_768;
    uStack_790 = uStack_760;
    face_forward(local_1f68,(Vec3fa *)&local_1a90->field_1,(Vec3fa *)&local_1c10->field_1);
    local_1aa0 = &local_1fa8;
    local_1818 = local_1da8;
    uStack_1810 = uStack_1da0;
    local_1fa8._0_8_ = local_1da8;
    local_1fa8._8_8_ = uStack_1da0;
    local_1c20 = &local_1fb8;
    local_1060 = &local_1928;
    local_da8 = (float)data_00;
    fStack_da4 = (float)((ulong)data_00 >> 0x20);
    local_1058 = local_da8 * local_da8;
    fStack_1054 = fStack_da4 * fStack_da4;
    fStack_1050 = local_1d80 * local_1d80;
    uStack_104c = 0;
    local_7f8 = CONCAT44(fStack_1054,local_1058);
    uStack_7f0 = (ulong)(uint)fStack_1050;
    local_7e8 = &local_828;
    local_688 = &local_838;
    local_438 = CONCAT44(fStack_1054,fStack_1054);
    uStack_430 = CONCAT44(fStack_1054,fStack_1054);
    local_648 = &local_848;
    local_498 = CONCAT44(fStack_1050,fStack_1050);
    uStack_490 = CONCAT44(fStack_1050,fStack_1050);
    local_4a8 = &local_868;
    local_418 = local_1058 + fStack_1054;
    fStack_414 = fStack_1054 + fStack_1054;
    fStack_410 = fStack_1050 + fStack_1054;
    fStack_40c = fStack_1054 + 0.0;
    local_488 = CONCAT44(fStack_414,local_418);
    uStack_480 = CONCAT44(fStack_40c,fStack_410);
    local_7e0 = &local_858;
    local_14cc = local_418 + fStack_1050;
    fStack_474 = fStack_414 + fStack_1050;
    fStack_470 = fStack_410 + fStack_1050;
    fStack_46c = fStack_40c + fStack_1050;
    local_808 = CONCAT44(fStack_474,local_14cc);
    uStack_800 = CONCAT44(fStack_46c,fStack_470);
    local_1488 = ZEXT416((uint)local_14cc);
    local_14e8 = CONCAT44(0,local_14cc);
    uStack_14e0 = 0;
    uStack_13a0 = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_14e8;
    local_14f8 = rsqrtss(auVar3,auVar3);
    local_148c = 0x3fc00000;
    local_14a8 = ZEXT416(0x3fc00000);
    local_1298 = local_14f8._0_8_;
    uVar8 = local_1298;
    uStack_1290 = local_14f8._8_8_;
    local_1298._0_4_ = local_14f8._0_4_;
    local_1288 = (ulong)(uint)((float)local_1298 * 1.5);
    uStack_1280 = 0;
    local_14ac = 0xbf000000;
    local_14c8 = ZEXT416(0xbf000000);
    local_12b8 = local_14c8._0_8_;
    uStack_12b0 = 0;
    local_12a8 = (ulong)(uint)(local_14cc * -0.5);
    uStack_12a0 = 0;
    local_12d8 = local_14f8._0_8_;
    uStack_12d0 = local_14f8._8_8_;
    local_19cc = local_14cc * -0.5 * (float)local_1298;
    local_12c8 = (ulong)(uint)local_19cc;
    uStack_12c0 = 0;
    local_12f8 = local_14f8._0_8_;
    uStack_12f0 = local_14f8._8_8_;
    local_12e8 = CONCAT44(local_14f8._4_4_,(float)local_1298 * (float)local_1298);
    uStack_12e0 = local_14f8._8_8_;
    local_1318 = local_12e8;
    uStack_1310 = local_14f8._8_8_;
    local_19cc = local_19cc * (float)local_1298 * (float)local_1298;
    local_1308 = (ulong)(uint)local_19cc;
    uStack_1300 = 0;
    local_1378 = local_1308;
    uStack_1370 = 0;
    local_19cc = (float)local_1298 * 1.5 + local_19cc;
    local_1368 = (ulong)(uint)local_19cc;
    uStack_1360 = 0;
    local_1508 = local_1368;
    uStack_1500 = 0;
    local_1138 = local_1368;
    uStack_1130 = 0;
    local_19b0 = &local_19e8;
    local_e38 = CONCAT44(local_19cc,local_19cc);
    uStack_e30 = CONCAT44(local_19cc,local_19cc);
    local_fa0 = &local_1fb8;
    local_fb0 = &local_19e8;
    local_f98 = local_da8 * local_19cc;
    fStack_f94 = fStack_da4 * local_19cc;
    fStack_f90 = local_1d80 * local_19cc;
    fStack_f8c = local_19cc * 0.0;
    local_f88 = &local_1fb8;
    local_1fb8._0_8_ = CONCAT44(fStack_f94,local_f98);
    local_1fb8._8_8_ = CONCAT44(fStack_f8c,fStack_f90);
    local_1ce8 = local_1f68;
    local_1ce0 = &stack0xffffffffffffe138;
    local_1c28 = &stack0xffffffffffffe148;
    local_1aa8 = &local_1da8;
    local_19c8 = &stack0xffffffffffffe148;
    local_19c0 = local_1c20;
    local_19b4 = local_19cc;
    local_1918 = &stack0xffffffffffffe148;
    local_1910 = &stack0xffffffffffffe148;
    local_1800 = local_1aa0;
    local_1778 = local_19cc;
    fStack_1774 = local_19cc;
    fStack_1770 = local_19cc;
    fStack_176c = local_19cc;
    local_1768 = local_19cc;
    local_146c = local_14cc;
    local_13a8 = local_14e8;
    local_1298 = uVar8;
    local_1070 = &stack0xffffffffffffe148;
    local_1068 = &stack0xffffffffffffe148;
    local_1048 = local_1060;
    local_fa8 = &stack0xffffffffffffe148;
    uStack_e20 = uVar2;
    uStack_db0 = uVar2;
    uStack_da0 = uVar2;
    local_810 = local_1060;
    local_690 = local_7e8;
    local_650 = local_7e8;
    local_4b0 = local_648;
    local_4a0 = local_7e0;
    local_478 = local_14cc;
    local_468 = local_7e0;
    local_460 = local_648;
    local_458 = local_4a8;
    local_450 = local_688;
    local_448 = local_7e8;
    local_440 = local_4a8;
    local_428 = local_7f8;
    uStack_420 = uStack_7f0;
    local_408 = local_4a8;
    local_400 = local_688;
    local_3f8 = local_7e8;
    local_2e8 = local_7e8;
    local_2e0 = local_688;
    local_2d8 = fStack_1054;
    fStack_2d4 = fStack_1054;
    fStack_2d0 = fStack_1054;
    fStack_2cc = fStack_1054;
    local_2c8 = local_438;
    uStack_2c0 = uStack_430;
    local_2b8 = local_688;
    local_2b0 = local_7e8;
    local_208 = local_7f8;
    uStack_200 = uStack_7f0;
    local_198 = local_7e8;
    local_190 = local_648;
    local_188 = fStack_1050;
    fStack_184 = fStack_1050;
    fStack_180 = fStack_1050;
    fStack_17c = fStack_1050;
    local_178 = local_498;
    uStack_170 = uStack_490;
    local_168 = local_648;
    local_160 = local_7e8;
    local_158 = local_7f8;
    uStack_150 = uStack_7f0;
    local_19e8 = local_e38;
    uStack_19e0 = uStack_e30;
    local_1928 = local_7f8;
    uStack_1920 = uStack_7f0;
    local_868 = local_488;
    uStack_860 = uStack_480;
    local_858 = local_808;
    uStack_850 = uStack_800;
    local_848 = local_498;
    uStack_840 = uStack_490;
    local_838 = local_438;
    uStack_830 = uStack_430;
    local_828 = local_7f8;
    uStack_820 = uStack_7f0;
    face_forward(local_1f98,(Vec3fa *)&local_1fa8.field_1,(Vec3fa *)&local_1fb8.field_1);
    if (**(int **)(*(long *)(*local_1d30 + 0x10) + (long)(int)local_1f4c * 8) == 0) {
      lVar1 = *(long *)(*(long *)(*local_1d30 + 0x10) + (long)(int)local_1f4c * 8);
      local_1e78 = *(undefined8 *)(lVar1 + 0x30);
      uStack_1e70 = *(undefined8 *)(lVar1 + 0x38);
    }
    fStack_d80 = -(float)uStack_1da0;
    local_d88 = (float)(local_1da8 ^ 0x8000000080000000);
    fStack_d84 = (float)((local_1da8 ^ 0x8000000080000000) >> 0x20);
    local_d98 = local_1f98._0_4_;
    fStack_d94 = local_1f98._4_4_;
    fVar7 = local_d88 * local_d98 + fStack_d84 * fStack_d94 + fStack_d80 * fStackY_1f90;
    local_e08 = (float)local_1e78;
    fStack_e04 = (float)((ulong)local_1e78 >> 0x20);
    fStack_e00 = (float)uStack_1e70;
    local_2074 = 1.0;
    if (local_e08 * fVar7 < 1.0) {
      local_2074 = local_e08 * fVar7;
    }
    local_2078 = 0.0;
    if (0.0 <= local_2074) {
      local_2078 = local_2074;
    }
    local_207c = 1.0;
    if (fStack_e04 * fVar7 < 1.0) {
      local_207c = fStack_e04 * fVar7;
    }
    local_2080 = 0.0;
    if (0.0 <= local_207c) {
      local_2080 = local_207c;
    }
    local_2084 = 1.0;
    if (fStack_e00 * fVar7 < 1.0) {
      local_2084 = fStack_e00 * fVar7;
    }
    local_2088 = 0.0;
    if (0.0 <= local_2084) {
      local_2088 = local_2084;
    }
    *(int *)(local_1d40 + (ulong)(local_1d38 * local_1d44 + local_1d34) * 4) =
         (int)(long)(local_2088 * 255.0) * 0x10000 + (int)(long)(local_2080 * 255.0) * 0x100 +
         (int)(long)(local_2078 * 255.0);
  }
  return;
}

Assistant:

void renderPixelStandard(const TutorialData& data,
                         int x, int y, 
                         int* pixels,
                         const unsigned int width,
                         const unsigned int height,
                         const float time,
                         const ISPCCamera& camera,
                         RayStats& stats,
                         const RTCFeatureFlags feature_mask)
{
  /* initialize sampler */
  RandomSampler sampler;
  RandomSampler_init(sampler, (int)x, (int)y, 0);

  /* initialize ray */
  float ray_time = data.motion_blur ? RandomSampler_get1D(sampler) : time;
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf, ray_time);

  /* intersect ray with scene */
  RTCIntersectArguments args;
  rtcInitIntersectArguments(&args);
  args.flags = data.iflags_coherent;
#if RTC_MIN_WIDTH
  args.minWidthDistanceFactor = 0.5f*data.min_width/width;
#endif
  args.feature_mask = feature_mask;
  
  rtcTraversableIntersect1(data.traversable,RTCRayHit_(ray),&args);
  RayStats_addRay(stats);

  /* shade background black */
  if (ray.geomID == RTC_INVALID_GEOMETRY_ID) {
    pixels[y*width+x] = 0;
    return;
  }

  /* shade all rays that hit something */
  Vec3fa color = Vec3fa(0.5f);

  /* compute differential geometry */
  DifferentialGeometry dg;
  dg.geomID = ray.geomID;
  dg.primID = ray.primID;
  dg.u = ray.u;
  dg.v = ray.v;
  dg.P  = ray.org+ray.tfar*ray.dir;
  dg.Ng = ray.Ng;
  dg.Ns = ray.Ng;

#if 0
  if (data.use_smooth_normals)
    if (ray.geomID != RTC_INVALID_GEOMETRY_ID) // FIXME: workaround for ISPC bug, location reached with empty execution mask
    {
      Vec3fa dPdu,dPdv;
      auto geomID = ray.geomID; {
        rtcInterpolate1(rtcGetGeometry(data.scene,geomID),ray.primID,ray.u,ray.v,RTC_BUFFER_TYPE_VERTEX,0,nullptr,&dPdu.x,&dPdv.x,3);
      }
      dg.Ns = cross(dPdv,dPdu);
    }
#endif

  int materialID = postIntersect(data,ray,dg);
  dg.Ng = face_forward(ray.dir,normalize(dg.Ng));
  dg.Ns = face_forward(ray.dir,normalize(dg.Ns));

  /* shade */
  if (data.ispc_scene->materials[materialID]->type == MATERIAL_OBJ) {
    ISPCOBJMaterial* material = (ISPCOBJMaterial*) data.ispc_scene->materials[materialID];
    color = Vec3fa(material->Kd);
  }

  color = color*dot(neg(ray.dir),dg.Ns);

  /* write color to framebuffer */
  unsigned int r = (unsigned int) (255.0f * clamp(color.x,0.0f,1.0f));
  unsigned int g = (unsigned int) (255.0f * clamp(color.y,0.0f,1.0f));
  unsigned int b = (unsigned int) (255.0f * clamp(color.z,0.0f,1.0f));
  pixels[y*width+x] = (b << 16) + (g << 8) + r;
}